

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O2

void __thiscall RayTracer::run(RayTracer *this,Scene *scene)

{
  Camera *this_00;
  int iVar1;
  ostream *poVar2;
  int x;
  int j;
  int y;
  int iVar3;
  Vector3 local_88;
  Vector3 dir;
  Color color;
  
  this->m_scene = scene;
  this_00 = scene->m_camera;
  iVar3 = this_00->m_h;
  x = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar1 = this_00->m_w;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; x != iVar1; x = x + 1) {
    for (y = 0; iVar3 != y; y = y + 1) {
      if (y == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"column ");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,x);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      Camera::emit(&dir,this_00,x,y);
      local_88.z = (this_00->m_eye).z;
      local_88.x = (this_00->m_eye).x;
      local_88.y = (this_00->m_eye).y;
      m_rayTraceing(&color,this,&local_88,&dir,1.0,1);
      Camera::setColor(this_00,x,y,&color);
    }
  }
  std::__cxx11::string::string((string *)&dir,"output.bmp",(allocator *)&color);
  Camera::print(this_00,(string *)&dir);
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void RayTracer::run(Scene* scene)
{
    m_scene = scene;
    Camera* camera = scene->getCamera();
    int w = camera->getW(), h = camera->getH();

    for (int i = 0; i < w; i++)
        for (int j = 0; j < h; j++)
        {
            if (!j) cout << "column " << i << endl;
            Vector3 dir = camera->emit(i, j);
            Color color = m_rayTraceing(camera->getEye(), dir, 1, 1);
            camera->setColor(i, j, color);
        }

    camera->print("output.bmp");
}